

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_ResetBufferProcessor(PaUtilBufferProcessor *bp)

{
  unsigned_long tempOutputBufferSize;
  unsigned_long tempInputBufferSize;
  PaUtilBufferProcessor *bp_local;
  
  bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
  bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;
  if (bp->framesInTempInputBuffer != 0) {
    memset(bp->tempInputBuffer,0,
           bp->framesPerTempBuffer * (ulong)bp->bytesPerUserInputSample *
           (ulong)bp->inputChannelCount);
  }
  if (bp->framesInTempOutputBuffer != 0) {
    memset(bp->tempOutputBuffer,0,
           bp->framesPerTempBuffer * (ulong)bp->bytesPerUserOutputSample *
           (ulong)bp->outputChannelCount);
  }
  return;
}

Assistant:

void PaUtil_ResetBufferProcessor( PaUtilBufferProcessor* bp )
{
    unsigned long tempInputBufferSize, tempOutputBufferSize;

    bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
    bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;

    if( bp->framesInTempInputBuffer > 0 )
    {
        tempInputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserInputSample * bp->inputChannelCount;
        memset( bp->tempInputBuffer, 0, tempInputBufferSize );
    }

    if( bp->framesInTempOutputBuffer > 0 )
    {
        tempOutputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserOutputSample * bp->outputChannelCount;
        memset( bp->tempOutputBuffer, 0, tempOutputBufferSize );
    }
}